

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

longlong NULLCFile::FileTell(File *file)

{
  long lVar1;
  char *error;
  
  if (file == (File *)0x0) {
    error = "ERROR: null pointer access";
  }
  else {
    if ((FILE *)file->handle != (FILE *)0x0) {
      lVar1 = ftell((FILE *)file->handle);
      return lVar1;
    }
    error = "Cannot tell cursor position in a closed file.";
  }
  nullcThrowError(error);
  return 0;
}

Assistant:

long long FileTell(File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot tell cursor position in a closed file.");
			return 0;
		}

		return ftell(file->handle);
	}